

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Geometry *pGVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  ulong uVar26;
  RayHitK<8> *pRVar27;
  long lVar28;
  Scene *pSVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [16];
  undefined4 uVar38;
  ulong unaff_R12;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar61 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [64];
  undefined1 auVar114 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2859;
  ulong local_2858;
  ulong local_2850;
  RayHitK<8> *local_2848;
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  undefined8 local_2820;
  float fStack_2818;
  float fStack_2814;
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  ulong local_27d8;
  undefined1 local_27d0 [16];
  ulong local_27c0;
  ulong local_27b8;
  ulong local_27b0;
  ulong local_27a8;
  undefined8 *local_27a0;
  void *local_2798;
  RTCRayQueryContext *local_2790;
  RayHitK<8> *local_2788;
  undefined1 (*local_2780) [32];
  undefined4 local_2778;
  float local_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 *local_2740;
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [32];
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined4 local_2420;
  undefined4 uStack_241c;
  undefined4 uStack_2418;
  undefined4 uStack_2414;
  undefined4 uStack_2410;
  undefined4 uStack_240c;
  undefined4 uStack_2408;
  undefined4 uStack_2404;
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar37 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar38 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar38;
  local_24e0._0_4_ = uVar38;
  local_24e0._8_4_ = uVar38;
  local_24e0._12_4_ = uVar38;
  local_24e0._16_4_ = uVar38;
  local_24e0._20_4_ = uVar38;
  local_24e0._24_4_ = uVar38;
  local_24e0._28_4_ = uVar38;
  auVar90 = ZEXT3264(local_24e0);
  uVar38 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar38;
  local_2500._0_4_ = uVar38;
  local_2500._8_4_ = uVar38;
  local_2500._12_4_ = uVar38;
  local_2500._16_4_ = uVar38;
  local_2500._20_4_ = uVar38;
  local_2500._24_4_ = uVar38;
  local_2500._28_4_ = uVar38;
  auVar97 = ZEXT3264(local_2500);
  uVar38 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar38;
  local_2520._0_4_ = uVar38;
  local_2520._8_4_ = uVar38;
  local_2520._12_4_ = uVar38;
  local_2520._16_4_ = uVar38;
  local_2520._20_4_ = uVar38;
  local_2520._24_4_ = uVar38;
  local_2520._28_4_ = uVar38;
  auVar99 = ZEXT3264(local_2520);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar17 = fVar1 * 0.99999964;
  local_2540._4_4_ = fVar17;
  local_2540._0_4_ = fVar17;
  local_2540._8_4_ = fVar17;
  local_2540._12_4_ = fVar17;
  local_2540._16_4_ = fVar17;
  local_2540._20_4_ = fVar17;
  local_2540._24_4_ = fVar17;
  local_2540._28_4_ = fVar17;
  auVar101 = ZEXT3264(local_2540);
  fVar17 = fVar2 * 0.99999964;
  local_2560._4_4_ = fVar17;
  local_2560._0_4_ = fVar17;
  local_2560._8_4_ = fVar17;
  local_2560._12_4_ = fVar17;
  local_2560._16_4_ = fVar17;
  local_2560._20_4_ = fVar17;
  local_2560._24_4_ = fVar17;
  local_2560._28_4_ = fVar17;
  auVar104 = ZEXT3264(local_2560);
  fVar17 = fVar3 * 0.99999964;
  local_2580._4_4_ = fVar17;
  local_2580._0_4_ = fVar17;
  local_2580._8_4_ = fVar17;
  local_2580._12_4_ = fVar17;
  local_2580._16_4_ = fVar17;
  local_2580._20_4_ = fVar17;
  local_2580._24_4_ = fVar17;
  local_2580._28_4_ = fVar17;
  auVar105 = ZEXT3264(local_2580);
  fVar1 = fVar1 * 1.0000004;
  local_25a0._4_4_ = fVar1;
  local_25a0._0_4_ = fVar1;
  local_25a0._8_4_ = fVar1;
  local_25a0._12_4_ = fVar1;
  local_25a0._16_4_ = fVar1;
  local_25a0._20_4_ = fVar1;
  local_25a0._24_4_ = fVar1;
  local_25a0._28_4_ = fVar1;
  auVar106 = ZEXT3264(local_25a0);
  fVar2 = fVar2 * 1.0000004;
  local_25c0._4_4_ = fVar2;
  local_25c0._0_4_ = fVar2;
  local_25c0._8_4_ = fVar2;
  local_25c0._12_4_ = fVar2;
  local_25c0._16_4_ = fVar2;
  local_25c0._20_4_ = fVar2;
  local_25c0._24_4_ = fVar2;
  local_25c0._28_4_ = fVar2;
  auVar108 = ZEXT3264(local_25c0);
  fVar3 = fVar3 * 1.0000004;
  local_25e0._4_4_ = fVar3;
  local_25e0._0_4_ = fVar3;
  local_25e0._8_4_ = fVar3;
  local_25e0._12_4_ = fVar3;
  local_25e0._16_4_ = fVar3;
  local_25e0._20_4_ = fVar3;
  local_25e0._24_4_ = fVar3;
  local_25e0._28_4_ = fVar3;
  auVar110 = ZEXT3264(local_25e0);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_27b8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_27c0 = uVar30 ^ 0x20;
  local_27a8 = uVar35 ^ 0x20;
  local_27b0 = local_27b8 ^ 0x20;
  iVar25 = (tray->tnear).field_0.i[k];
  local_26c0._4_4_ = iVar25;
  local_26c0._0_4_ = iVar25;
  local_26c0._8_4_ = iVar25;
  local_26c0._12_4_ = iVar25;
  local_26c0._16_4_ = iVar25;
  local_26c0._20_4_ = iVar25;
  local_26c0._24_4_ = iVar25;
  local_26c0._28_4_ = iVar25;
  auVar114 = ZEXT3264(local_26c0);
  iVar25 = (tray->tfar).field_0.i[k];
  auVar52 = ZEXT3264(CONCAT428(iVar25,CONCAT424(iVar25,CONCAT420(iVar25,CONCAT416(iVar25,CONCAT412(
                                                  iVar25,CONCAT48(iVar25,CONCAT44(iVar25,iVar25)))))
                                               )));
  iVar25 = 1 << ((uint)k & 0x1f);
  auVar62._4_4_ = iVar25;
  auVar62._0_4_ = iVar25;
  auVar62._8_4_ = iVar25;
  auVar62._12_4_ = iVar25;
  auVar62._16_4_ = iVar25;
  auVar62._20_4_ = iVar25;
  auVar62._24_4_ = iVar25;
  auVar62._28_4_ = iVar25;
  auVar96 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar62 = vpand_avx2(auVar62,auVar96);
  local_2600 = vpcmpeqd_avx2(auVar62,auVar96);
  uVar26 = local_27b8;
  uVar42 = local_27c0;
  local_2858 = uVar35;
  local_2850 = uVar30;
  local_2848 = ray;
  do {
    do {
      do {
        if (pauVar37 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar36 = pauVar37 + -1;
        pauVar37 = pauVar37 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar36 + 8));
      uVar41 = *(ulong *)*pauVar37;
      do {
        auVar98 = auVar99._0_32_;
        auVar96 = auVar97._0_32_;
        auVar62 = auVar90._0_32_;
        if ((uVar41 & 8) == 0) {
          auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + uVar30),auVar62);
          auVar19._4_4_ = auVar101._4_4_ * auVar18._4_4_;
          auVar19._0_4_ = auVar101._0_4_ * auVar18._0_4_;
          auVar19._8_4_ = auVar101._8_4_ * auVar18._8_4_;
          auVar19._12_4_ = auVar101._12_4_ * auVar18._12_4_;
          auVar19._16_4_ = auVar101._16_4_ * auVar18._16_4_;
          auVar19._20_4_ = auVar101._20_4_ * auVar18._20_4_;
          auVar19._24_4_ = auVar101._24_4_ * auVar18._24_4_;
          auVar19._28_4_ = auVar18._28_4_;
          auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + uVar35),auVar96);
          auVar20._4_4_ = auVar104._4_4_ * auVar18._4_4_;
          auVar20._0_4_ = auVar104._0_4_ * auVar18._0_4_;
          auVar20._8_4_ = auVar104._8_4_ * auVar18._8_4_;
          auVar20._12_4_ = auVar104._12_4_ * auVar18._12_4_;
          auVar20._16_4_ = auVar104._16_4_ * auVar18._16_4_;
          auVar20._20_4_ = auVar104._20_4_ * auVar18._20_4_;
          auVar20._24_4_ = auVar104._24_4_ * auVar18._24_4_;
          auVar20._28_4_ = auVar18._28_4_;
          auVar18 = vmaxps_avx(auVar19,auVar20);
          auVar19 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + uVar26),auVar98);
          auVar21._4_4_ = auVar105._4_4_ * auVar19._4_4_;
          auVar21._0_4_ = auVar105._0_4_ * auVar19._0_4_;
          auVar21._8_4_ = auVar105._8_4_ * auVar19._8_4_;
          auVar21._12_4_ = auVar105._12_4_ * auVar19._12_4_;
          auVar21._16_4_ = auVar105._16_4_ * auVar19._16_4_;
          auVar21._20_4_ = auVar105._20_4_ * auVar19._20_4_;
          auVar21._24_4_ = auVar105._24_4_ * auVar19._24_4_;
          auVar21._28_4_ = auVar19._28_4_;
          auVar19 = vmaxps_avx(auVar21,auVar114._0_32_);
          local_24c0 = vmaxps_avx(auVar18,auVar19);
          auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + uVar42),auVar62);
          auVar22._4_4_ = auVar106._4_4_ * auVar18._4_4_;
          auVar22._0_4_ = auVar106._0_4_ * auVar18._0_4_;
          auVar22._8_4_ = auVar106._8_4_ * auVar18._8_4_;
          auVar22._12_4_ = auVar106._12_4_ * auVar18._12_4_;
          auVar22._16_4_ = auVar106._16_4_ * auVar18._16_4_;
          auVar22._20_4_ = auVar106._20_4_ * auVar18._20_4_;
          auVar22._24_4_ = auVar106._24_4_ * auVar18._24_4_;
          auVar22._28_4_ = auVar18._28_4_;
          auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + local_27a8),auVar96);
          auVar23._4_4_ = auVar108._4_4_ * auVar18._4_4_;
          auVar23._0_4_ = auVar108._0_4_ * auVar18._0_4_;
          auVar23._8_4_ = auVar108._8_4_ * auVar18._8_4_;
          auVar23._12_4_ = auVar108._12_4_ * auVar18._12_4_;
          auVar23._16_4_ = auVar108._16_4_ * auVar18._16_4_;
          auVar23._20_4_ = auVar108._20_4_ * auVar18._20_4_;
          auVar23._24_4_ = auVar108._24_4_ * auVar18._24_4_;
          auVar23._28_4_ = auVar18._28_4_;
          auVar18 = vminps_avx(auVar22,auVar23);
          auVar19 = vsubps_avx(*(undefined1 (*) [32])(uVar41 + 0x40 + local_27b0),auVar98);
          auVar24._4_4_ = auVar110._4_4_ * auVar19._4_4_;
          auVar24._0_4_ = auVar110._0_4_ * auVar19._0_4_;
          auVar24._8_4_ = auVar110._8_4_ * auVar19._8_4_;
          auVar24._12_4_ = auVar110._12_4_ * auVar19._12_4_;
          auVar24._16_4_ = auVar110._16_4_ * auVar19._16_4_;
          auVar24._20_4_ = auVar110._20_4_ * auVar19._20_4_;
          auVar24._24_4_ = auVar110._24_4_ * auVar19._24_4_;
          auVar24._28_4_ = auVar19._28_4_;
          auVar19 = vminps_avx(auVar24,auVar52._0_32_);
          auVar18 = vminps_avx(auVar18,auVar19);
          auVar18 = vcmpps_avx(local_24c0,auVar18,2);
          uVar38 = vmovmskps_avx(auVar18);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar38);
        }
        if ((uVar41 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar25 = 4;
          }
          else {
            uVar40 = uVar41 & 0xfffffffffffffff0;
            lVar28 = 0;
            for (uVar41 = unaff_R12; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
            iVar25 = 0;
            uVar32 = unaff_R12 - 1 & unaff_R12;
            uVar41 = *(ulong *)(uVar40 + lVar28 * 8);
            if (uVar32 != 0) {
              uVar6 = *(uint *)(local_24c0 + lVar28 * 4);
              lVar28 = 0;
              for (uVar30 = uVar32; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                lVar28 = lVar28 + 1;
              }
              uVar32 = uVar32 - 1 & uVar32;
              uVar7 = *(ulong *)(uVar40 + lVar28 * 8);
              uVar5 = *(uint *)(local_24c0 + lVar28 * 4);
              uVar30 = local_2850;
              uVar35 = local_2858;
              if (uVar32 == 0) {
                if (uVar6 < uVar5) {
                  *(ulong *)*pauVar37 = uVar7;
                  *(uint *)(*pauVar37 + 8) = uVar5;
                  pauVar37 = pauVar37 + 1;
                }
                else {
                  *(ulong *)*pauVar37 = uVar41;
                  *(uint *)(*pauVar37 + 8) = uVar6;
                  pauVar37 = pauVar37 + 1;
                  uVar41 = uVar7;
                }
              }
              else {
                auVar53._8_8_ = 0;
                auVar53._0_8_ = uVar41;
                auVar53 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar6));
                auVar64._8_8_ = 0;
                auVar64._0_8_ = uVar7;
                auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar5));
                lVar28 = 0;
                for (uVar41 = uVar32; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000)
                {
                  lVar28 = lVar28 + 1;
                }
                uVar32 = uVar32 - 1 & uVar32;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = *(ulong *)(uVar40 + lVar28 * 8);
                auVar54 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_24c0 + lVar28 * 4)));
                auVar70 = vpcmpgtd_avx(auVar64,auVar53);
                if (uVar32 == 0) {
                  auVar80 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar64,auVar53,auVar80);
                  auVar53 = vblendvps_avx(auVar53,auVar64,auVar80);
                  auVar64 = vpcmpgtd_avx(auVar54,auVar70);
                  auVar80 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar54,auVar70,auVar80);
                  auVar70 = vblendvps_avx(auVar70,auVar54,auVar80);
                  auVar54 = vpcmpgtd_avx(auVar70,auVar53);
                  auVar80 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar70,auVar53,auVar80);
                  auVar53 = vblendvps_avx(auVar53,auVar70,auVar80);
                  *pauVar37 = auVar53;
                  pauVar37[1] = auVar54;
                  uVar41 = auVar64._0_8_;
                  pauVar37 = pauVar37 + 2;
                }
                else {
                  lVar28 = 0;
                  for (uVar41 = uVar32; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000
                      ) {
                    lVar28 = lVar28 + 1;
                  }
                  uVar32 = uVar32 - 1 & uVar32;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = *(ulong *)(uVar40 + lVar28 * 8);
                  auVar80 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_24c0 + lVar28 * 4)));
                  if (uVar32 == 0) {
                    auVar44 = vpshufd_avx(auVar70,0xaa);
                    auVar70 = vblendvps_avx(auVar64,auVar53,auVar44);
                    auVar53 = vblendvps_avx(auVar53,auVar64,auVar44);
                    auVar64 = vpcmpgtd_avx(auVar80,auVar54);
                    auVar44 = vpshufd_avx(auVar64,0xaa);
                    auVar64 = vblendvps_avx(auVar80,auVar54,auVar44);
                    auVar54 = vblendvps_avx(auVar54,auVar80,auVar44);
                    auVar80 = vpcmpgtd_avx(auVar54,auVar53);
                    auVar44 = vpshufd_avx(auVar80,0xaa);
                    auVar80 = vblendvps_avx(auVar54,auVar53,auVar44);
                    auVar53 = vblendvps_avx(auVar53,auVar54,auVar44);
                    auVar54 = vpcmpgtd_avx(auVar64,auVar70);
                    auVar44 = vpshufd_avx(auVar54,0xaa);
                    auVar54 = vblendvps_avx(auVar64,auVar70,auVar44);
                    auVar64 = vblendvps_avx(auVar70,auVar64,auVar44);
                    auVar70 = vpcmpgtd_avx(auVar80,auVar64);
                    auVar44 = vpshufd_avx(auVar70,0xaa);
                    auVar70 = vblendvps_avx(auVar80,auVar64,auVar44);
                    auVar64 = vblendvps_avx(auVar64,auVar80,auVar44);
                    *pauVar37 = auVar53;
                    pauVar37[1] = auVar64;
                    pauVar37[2] = auVar70;
                    uVar41 = auVar54._0_8_;
                    pauVar36 = pauVar37 + 3;
                  }
                  else {
                    *pauVar37 = auVar53;
                    pauVar37[1] = auVar64;
                    pauVar37[2] = auVar54;
                    pauVar37[3] = auVar80;
                    lVar28 = 0x30;
                    do {
                      lVar34 = lVar28;
                      lVar28 = 0;
                      for (uVar41 = uVar32; (uVar41 & 1) == 0;
                          uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                        lVar28 = lVar28 + 1;
                      }
                      auVar54._8_8_ = 0;
                      auVar54._0_8_ = *(ulong *)(uVar40 + lVar28 * 8);
                      auVar53 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_24c0 + lVar28 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar37[1] + lVar34) = auVar53;
                      uVar32 = uVar32 - 1 & uVar32;
                      lVar28 = lVar34 + 0x10;
                    } while (uVar32 != 0);
                    pauVar36 = (undefined1 (*) [16])(pauVar37[1] + lVar34);
                    if (lVar34 + 0x10 != 0) {
                      lVar28 = 0x10;
                      pauVar31 = pauVar37;
                      do {
                        auVar53 = pauVar31[1];
                        uVar6 = *(uint *)(pauVar31[1] + 8);
                        pauVar31 = pauVar31 + 1;
                        lVar34 = lVar28;
                        do {
                          if (uVar6 <= *(uint *)(pauVar37[-1] + lVar34 + 8)) {
                            pauVar33 = (undefined1 (*) [16])(*pauVar37 + lVar34);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar37 + lVar34) =
                               *(undefined1 (*) [16])(pauVar37[-1] + lVar34);
                          lVar34 = lVar34 + -0x10;
                          pauVar33 = pauVar37;
                        } while (lVar34 != 0);
                        *pauVar33 = auVar53;
                        lVar28 = lVar28 + 0x10;
                      } while (pauVar36 != pauVar31);
                    }
                    uVar41 = *(ulong *)*pauVar36;
                  }
                  auVar90 = ZEXT3264(auVar62);
                  auVar97 = ZEXT3264(auVar96);
                  auVar99 = ZEXT3264(auVar98);
                  auVar101 = ZEXT3264(auVar101._0_32_);
                  auVar104 = ZEXT3264(auVar104._0_32_);
                  auVar105 = ZEXT3264(auVar105._0_32_);
                  auVar106 = ZEXT3264(auVar106._0_32_);
                  auVar108 = ZEXT3264(auVar108._0_32_);
                  auVar110 = ZEXT3264(auVar110._0_32_);
                  auVar114 = ZEXT3264(local_26c0);
                  ray = local_2848;
                  pauVar37 = pauVar36;
                  iVar25 = 0;
                }
              }
            }
          }
        }
        else {
          iVar25 = 6;
        }
      } while (iVar25 == 0);
    } while (iVar25 != 6);
    lVar28 = (ulong)((uint)uVar41 & 0xf) - 8;
    if (lVar28 != 0) {
      uVar41 = uVar41 & 0xfffffffffffffff0;
      lVar34 = 0;
      local_27d8 = unaff_R12;
      do {
        lVar43 = lVar34 * 0xb0;
        uVar38 = *(undefined4 *)(ray + k * 4);
        auVar44._4_4_ = uVar38;
        auVar44._0_4_ = uVar38;
        auVar44._8_4_ = uVar38;
        auVar44._12_4_ = uVar38;
        uVar38 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar65._4_4_ = uVar38;
        auVar65._0_4_ = uVar38;
        auVar65._8_4_ = uVar38;
        auVar65._12_4_ = uVar38;
        uVar38 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar71._4_4_ = uVar38;
        auVar71._0_4_ = uVar38;
        auVar71._8_4_ = uVar38;
        auVar71._12_4_ = uVar38;
        auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + lVar43),auVar44);
        local_2810 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x10 + lVar43),auVar65);
        local_27d0 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + lVar43),auVar71);
        auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x30 + lVar43),auVar44);
        auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x40 + lVar43),auVar65);
        auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x50 + lVar43),auVar71);
        auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x60 + lVar43),auVar44);
        auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x70 + lVar43),auVar65);
        auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x80 + lVar43),auVar71);
        local_2610 = vsubps_avx(auVar80,auVar70);
        local_2630 = vsubps_avx(auVar44,local_2810);
        local_2620 = vsubps_avx(auVar56,local_27d0);
        auVar45._0_4_ = auVar70._0_4_ + auVar80._0_4_;
        auVar45._4_4_ = auVar70._4_4_ + auVar80._4_4_;
        auVar45._8_4_ = auVar70._8_4_ + auVar80._8_4_;
        auVar45._12_4_ = auVar70._12_4_ + auVar80._12_4_;
        auVar72._0_4_ = local_2810._0_4_ + auVar44._0_4_;
        auVar72._4_4_ = local_2810._4_4_ + auVar44._4_4_;
        auVar72._8_4_ = local_2810._8_4_ + auVar44._8_4_;
        auVar72._12_4_ = local_2810._12_4_ + auVar44._12_4_;
        fVar109 = local_27d0._0_4_;
        auVar75._0_4_ = fVar109 + auVar56._0_4_;
        fVar111 = local_27d0._4_4_;
        auVar75._4_4_ = fVar111 + auVar56._4_4_;
        fVar112 = local_27d0._8_4_;
        auVar75._8_4_ = fVar112 + auVar56._8_4_;
        fVar113 = local_27d0._12_4_;
        auVar75._12_4_ = fVar113 + auVar56._12_4_;
        auVar107._0_4_ = local_2620._0_4_ * auVar72._0_4_;
        auVar107._4_4_ = local_2620._4_4_ * auVar72._4_4_;
        auVar107._8_4_ = local_2620._8_4_ * auVar72._8_4_;
        auVar107._12_4_ = local_2620._12_4_ * auVar72._12_4_;
        auVar55 = vfmsub231ps_fma(auVar107,local_2630,auVar75);
        auVar76._0_4_ = auVar75._0_4_ * local_2610._0_4_;
        auVar76._4_4_ = auVar75._4_4_ * local_2610._4_4_;
        auVar76._8_4_ = auVar75._8_4_ * local_2610._8_4_;
        auVar76._12_4_ = auVar75._12_4_ * local_2610._12_4_;
        auVar65 = vfmsub231ps_fma(auVar76,local_2620,auVar45);
        auVar46._0_4_ = local_2630._0_4_ * auVar45._0_4_;
        auVar46._4_4_ = local_2630._4_4_ * auVar45._4_4_;
        auVar46._8_4_ = local_2630._8_4_ * auVar45._8_4_;
        auVar46._12_4_ = local_2630._12_4_ * auVar45._12_4_;
        auVar45 = vfmsub231ps_fma(auVar46,local_2610,auVar72);
        local_2820._4_4_ = *(float *)(ray + k * 4 + 0xc0);
        auVar73._0_4_ = local_2820._4_4_ * auVar45._0_4_;
        auVar73._4_4_ = local_2820._4_4_ * auVar45._4_4_;
        auVar73._8_4_ = local_2820._4_4_ * auVar45._8_4_;
        auVar73._12_4_ = local_2820._4_4_ * auVar45._12_4_;
        uVar38 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar100._4_4_ = uVar38;
        auVar100._0_4_ = uVar38;
        auVar100._8_4_ = uVar38;
        auVar100._12_4_ = uVar38;
        auVar65 = vfmadd231ps_fma(auVar73,auVar100,auVar65);
        uVar38 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_2830._4_4_ = uVar38;
        local_2830._0_4_ = uVar38;
        local_2830._8_4_ = uVar38;
        local_2830._12_4_ = uVar38;
        local_2670 = vfmadd231ps_fma(auVar65,local_2830,auVar55);
        local_2640 = vsubps_avx(local_2810,auVar64);
        local_2650 = vsubps_avx(local_27d0,auVar54);
        auVar81._0_4_ = auVar64._0_4_ + local_2810._0_4_;
        auVar81._4_4_ = auVar64._4_4_ + local_2810._4_4_;
        auVar81._8_4_ = auVar64._8_4_ + local_2810._8_4_;
        auVar81._12_4_ = auVar64._12_4_ + local_2810._12_4_;
        auVar77._0_4_ = fVar109 + auVar54._0_4_;
        auVar77._4_4_ = fVar111 + auVar54._4_4_;
        auVar77._8_4_ = fVar112 + auVar54._8_4_;
        auVar77._12_4_ = fVar113 + auVar54._12_4_;
        fVar1 = local_2650._0_4_;
        auVar84._0_4_ = auVar81._0_4_ * fVar1;
        fVar17 = local_2650._4_4_;
        auVar84._4_4_ = auVar81._4_4_ * fVar17;
        fVar11 = local_2650._8_4_;
        auVar84._8_4_ = auVar81._8_4_ * fVar11;
        fVar14 = local_2650._12_4_;
        auVar84._12_4_ = auVar81._12_4_ * fVar14;
        auVar55 = vfmsub231ps_fma(auVar84,local_2640,auVar77);
        local_2660 = vsubps_avx(auVar70,auVar53);
        fVar2 = local_2660._0_4_;
        auVar91._0_4_ = auVar77._0_4_ * fVar2;
        fVar9 = local_2660._4_4_;
        auVar91._4_4_ = auVar77._4_4_ * fVar9;
        fVar12 = local_2660._8_4_;
        auVar91._8_4_ = auVar77._8_4_ * fVar12;
        fVar15 = local_2660._12_4_;
        auVar91._12_4_ = auVar77._12_4_ * fVar15;
        auVar78._0_4_ = auVar70._0_4_ + auVar53._0_4_;
        auVar78._4_4_ = auVar70._4_4_ + auVar53._4_4_;
        auVar78._8_4_ = auVar70._8_4_ + auVar53._8_4_;
        auVar78._12_4_ = auVar70._12_4_ + auVar53._12_4_;
        auVar65 = vfmsub231ps_fma(auVar91,local_2650,auVar78);
        fVar3 = local_2640._0_4_;
        auVar79._0_4_ = auVar78._0_4_ * fVar3;
        fVar10 = local_2640._4_4_;
        auVar79._4_4_ = auVar78._4_4_ * fVar10;
        fVar13 = local_2640._8_4_;
        auVar79._8_4_ = auVar78._8_4_ * fVar13;
        fVar16 = local_2640._12_4_;
        auVar79._12_4_ = auVar78._12_4_ * fVar16;
        auVar45 = vfmsub231ps_fma(auVar79,local_2660,auVar81);
        auVar47._0_4_ = local_2820._4_4_ * auVar45._0_4_;
        auVar47._4_4_ = local_2820._4_4_ * auVar45._4_4_;
        auVar47._8_4_ = local_2820._4_4_ * auVar45._8_4_;
        auVar47._12_4_ = local_2820._4_4_ * auVar45._12_4_;
        auVar65 = vfmadd231ps_fma(auVar47,auVar100,auVar65);
        local_2760 = vfmadd231ps_fma(auVar65,local_2830,auVar55);
        auVar65 = vsubps_avx(auVar53,auVar80);
        auVar85._0_4_ = auVar53._0_4_ + auVar80._0_4_;
        auVar85._4_4_ = auVar53._4_4_ + auVar80._4_4_;
        auVar85._8_4_ = auVar53._8_4_ + auVar80._8_4_;
        auVar85._12_4_ = auVar53._12_4_ + auVar80._12_4_;
        auVar80 = vsubps_avx(auVar64,auVar44);
        auVar66._0_4_ = auVar64._0_4_ + auVar44._0_4_;
        auVar66._4_4_ = auVar64._4_4_ + auVar44._4_4_;
        auVar66._8_4_ = auVar64._8_4_ + auVar44._8_4_;
        auVar66._12_4_ = auVar64._12_4_ + auVar44._12_4_;
        auVar44 = vsubps_avx(auVar54,auVar56);
        auVar55._0_4_ = auVar54._0_4_ + auVar56._0_4_;
        auVar55._4_4_ = auVar54._4_4_ + auVar56._4_4_;
        auVar55._8_4_ = auVar54._8_4_ + auVar56._8_4_;
        auVar55._12_4_ = auVar54._12_4_ + auVar56._12_4_;
        auVar82._0_4_ = auVar44._0_4_ * auVar66._0_4_;
        auVar82._4_4_ = auVar44._4_4_ * auVar66._4_4_;
        auVar82._8_4_ = auVar44._8_4_ * auVar66._8_4_;
        auVar82._12_4_ = auVar44._12_4_ * auVar66._12_4_;
        auVar64 = vfmsub231ps_fma(auVar82,auVar80,auVar55);
        auVar56._0_4_ = auVar55._0_4_ * auVar65._0_4_;
        auVar56._4_4_ = auVar55._4_4_ * auVar65._4_4_;
        auVar56._8_4_ = auVar55._8_4_ * auVar65._8_4_;
        auVar56._12_4_ = auVar55._12_4_ * auVar65._12_4_;
        auVar53 = vfmsub231ps_fma(auVar56,auVar44,auVar85);
        auVar86._0_4_ = auVar80._0_4_ * auVar85._0_4_;
        auVar86._4_4_ = auVar80._4_4_ * auVar85._4_4_;
        auVar86._8_4_ = auVar80._8_4_ * auVar85._8_4_;
        auVar86._12_4_ = auVar80._12_4_ * auVar85._12_4_;
        auVar54 = vfmsub231ps_fma(auVar86,auVar65,auVar66);
        local_2820._0_4_ = local_2820._4_4_;
        fStack_2818 = local_2820._4_4_;
        fStack_2814 = local_2820._4_4_;
        auVar67._0_4_ = local_2820._4_4_ * auVar54._0_4_;
        auVar67._4_4_ = local_2820._4_4_ * auVar54._4_4_;
        auVar67._8_4_ = local_2820._4_4_ * auVar54._8_4_;
        auVar67._12_4_ = local_2820._4_4_ * auVar54._12_4_;
        auVar53 = vfmadd231ps_fma(auVar67,auVar100,auVar53);
        auVar54 = vfmadd231ps_fma(auVar53,local_2830,auVar64);
        local_2770 = local_2670._0_4_;
        fStack_276c = local_2670._4_4_;
        fStack_2768 = local_2670._8_4_;
        fStack_2764 = local_2670._12_4_;
        local_2750._0_4_ = auVar54._0_4_ + local_2760._0_4_ + local_2770;
        local_2750._4_4_ = auVar54._4_4_ + local_2760._4_4_ + fStack_276c;
        local_2750._8_4_ = auVar54._8_4_ + local_2760._8_4_ + fStack_2768;
        local_2750._12_4_ = auVar54._12_4_ + local_2760._12_4_ + fStack_2764;
        auVar83._8_4_ = 0x7fffffff;
        auVar83._0_8_ = 0x7fffffff7fffffff;
        auVar83._12_4_ = 0x7fffffff;
        auVar53 = vminps_avx(local_2670,local_2760);
        auVar53 = vminps_avx(auVar53,auVar54);
        local_2680 = vandps_avx(local_2750,auVar83);
        auVar92._0_4_ = local_2680._0_4_ * 1.1920929e-07;
        auVar92._4_4_ = local_2680._4_4_ * 1.1920929e-07;
        auVar92._8_4_ = local_2680._8_4_ * 1.1920929e-07;
        auVar92._12_4_ = local_2680._12_4_ * 1.1920929e-07;
        uVar26 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
        auVar87._0_8_ = uVar26 ^ 0x8000000080000000;
        auVar87._8_4_ = -auVar92._8_4_;
        auVar87._12_4_ = -auVar92._12_4_;
        auVar53 = vcmpps_avx(auVar53,auVar87,5);
        auVar64 = vmaxps_avx(local_2670,local_2760);
        auVar64 = vmaxps_avx(auVar64,auVar54);
        auVar64 = vcmpps_avx(auVar64,auVar92,2);
        local_2840 = vorps_avx(auVar53,auVar64);
        if ((((local_2840 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_2840 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_2840 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_2840[0xf] < '\0') {
          auVar68._0_4_ = fVar3 * local_2620._0_4_;
          auVar68._4_4_ = fVar10 * local_2620._4_4_;
          auVar68._8_4_ = fVar13 * local_2620._8_4_;
          auVar68._12_4_ = fVar16 * local_2620._12_4_;
          auVar88._0_4_ = fVar2 * local_2630._0_4_;
          auVar88._4_4_ = fVar9 * local_2630._4_4_;
          auVar88._8_4_ = fVar12 * local_2630._8_4_;
          auVar88._12_4_ = fVar15 * local_2630._12_4_;
          auVar54 = vfmsub213ps_fma(local_2630,local_2650,auVar68);
          auVar93._0_4_ = auVar80._0_4_ * fVar1;
          auVar93._4_4_ = auVar80._4_4_ * fVar17;
          auVar93._8_4_ = auVar80._8_4_ * fVar11;
          auVar93._12_4_ = auVar80._12_4_ * fVar14;
          auVar57._0_4_ = fVar2 * auVar44._0_4_;
          auVar57._4_4_ = fVar9 * auVar44._4_4_;
          auVar57._8_4_ = fVar12 * auVar44._8_4_;
          auVar57._12_4_ = fVar15 * auVar44._12_4_;
          auVar44 = vfmsub213ps_fma(auVar44,local_2640,auVar93);
          auVar53 = vandps_avx(auVar68,auVar83);
          auVar64 = vandps_avx(auVar93,auVar83);
          auVar53 = vcmpps_avx(auVar53,auVar64,1);
          local_26f0 = vblendvps_avx(auVar44,auVar54,auVar53);
          auVar94._0_4_ = fVar3 * auVar65._0_4_;
          auVar94._4_4_ = fVar10 * auVar65._4_4_;
          auVar94._8_4_ = fVar13 * auVar65._8_4_;
          auVar94._12_4_ = fVar16 * auVar65._12_4_;
          auVar54 = vfmsub213ps_fma(auVar65,local_2650,auVar57);
          auVar102._0_4_ = local_2610._0_4_ * fVar1;
          auVar102._4_4_ = local_2610._4_4_ * fVar17;
          auVar102._8_4_ = local_2610._8_4_ * fVar11;
          auVar102._12_4_ = local_2610._12_4_ * fVar14;
          auVar44 = vfmsub213ps_fma(local_2620,local_2660,auVar102);
          auVar53 = vandps_avx(auVar102,auVar83);
          auVar64 = vandps_avx(auVar57,auVar83);
          auVar53 = vcmpps_avx(auVar53,auVar64,1);
          local_26e0 = vblendvps_avx(auVar54,auVar44,auVar53);
          auVar54 = vfmsub213ps_fma(local_2610,local_2640,auVar88);
          auVar80 = vfmsub213ps_fma(auVar80,local_2660,auVar94);
          auVar53 = vandps_avx(auVar88,auVar83);
          auVar64 = vandps_avx(auVar94,auVar83);
          auVar53 = vcmpps_avx(auVar53,auVar64,1);
          local_26d0 = vblendvps_avx(auVar80,auVar54,auVar53);
          auVar58._0_4_ = local_26d0._0_4_ * local_2820._4_4_;
          auVar58._4_4_ = local_26d0._4_4_ * local_2820._4_4_;
          auVar58._8_4_ = local_26d0._8_4_ * local_2820._4_4_;
          auVar58._12_4_ = local_26d0._12_4_ * local_2820._4_4_;
          auVar53 = vfmadd213ps_fma(auVar100,local_26e0,auVar58);
          auVar53 = vfmadd213ps_fma(local_2830,local_26f0,auVar53);
          auVar89._0_4_ = auVar53._0_4_ + auVar53._0_4_;
          auVar89._4_4_ = auVar53._4_4_ + auVar53._4_4_;
          auVar89._8_4_ = auVar53._8_4_ + auVar53._8_4_;
          auVar89._12_4_ = auVar53._12_4_ + auVar53._12_4_;
          auVar59._0_4_ = local_26d0._0_4_ * fVar109;
          auVar59._4_4_ = local_26d0._4_4_ * fVar111;
          auVar59._8_4_ = local_26d0._8_4_ * fVar112;
          auVar59._12_4_ = local_26d0._12_4_ * fVar113;
          auVar53 = vfmadd213ps_fma(local_2810,local_26e0,auVar59);
          auVar64 = vfmadd213ps_fma(auVar70,local_26f0,auVar53);
          auVar53 = vrcpps_avx(auVar89);
          auVar103._8_4_ = 0x3f800000;
          auVar103._0_8_ = &DAT_3f8000003f800000;
          auVar103._12_4_ = 0x3f800000;
          auVar70 = vfnmadd213ps_fma(auVar53,auVar89,auVar103);
          auVar53 = vfmadd132ps_fma(auVar70,auVar53,auVar53);
          local_2700._0_4_ = auVar53._0_4_ * (auVar64._0_4_ + auVar64._0_4_);
          local_2700._4_4_ = auVar53._4_4_ * (auVar64._4_4_ + auVar64._4_4_);
          local_2700._8_4_ = auVar53._8_4_ * (auVar64._8_4_ + auVar64._8_4_);
          local_2700._12_4_ = auVar53._12_4_ * (auVar64._12_4_ + auVar64._12_4_);
          auVar52 = ZEXT1664(local_2700);
          uVar38 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar60._4_4_ = uVar38;
          auVar60._0_4_ = uVar38;
          auVar60._8_4_ = uVar38;
          auVar60._12_4_ = uVar38;
          auVar53 = vcmpps_avx(auVar60,local_2700,2);
          uVar38 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar95._4_4_ = uVar38;
          auVar95._0_4_ = uVar38;
          auVar95._8_4_ = uVar38;
          auVar95._12_4_ = uVar38;
          auVar64 = vcmpps_avx(local_2700,auVar95,2);
          auVar53 = vandps_avx(auVar53,auVar64);
          auVar64 = local_2840 & auVar53;
          if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar64[0xf] < '\0') {
            auVar53 = vandps_avx(auVar53,local_2840);
            auVar64 = vcmpps_avx(auVar89,_DAT_01feba10,4);
            auVar70 = auVar64 & auVar53;
            if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar70[0xf] < '\0') {
              local_27f0 = vandps_avx(auVar53,auVar64);
              local_2740 = &local_2859;
              pSVar29 = context->scene;
              auVar53 = vrcpps_avx(local_2750);
              auVar74._8_4_ = 0x3f800000;
              auVar74._0_8_ = &DAT_3f8000003f800000;
              auVar74._12_4_ = 0x3f800000;
              auVar64 = vfnmadd213ps_fma(local_2750,auVar53,auVar74);
              auVar64 = vfmadd132ps_fma(auVar64,auVar53,auVar53);
              auVar69._8_4_ = 0x219392ef;
              auVar69._0_8_ = 0x219392ef219392ef;
              auVar69._12_4_ = 0x219392ef;
              auVar53 = vcmpps_avx(local_2680,auVar69,5);
              auVar53 = vandps_avx(auVar64,auVar53);
              auVar48._0_4_ = local_2770 * auVar53._0_4_;
              auVar48._4_4_ = fStack_276c * auVar53._4_4_;
              auVar48._8_4_ = fStack_2768 * auVar53._8_4_;
              auVar48._12_4_ = fStack_2764 * auVar53._12_4_;
              local_2720 = vminps_avx(auVar48,auVar74);
              auVar49._0_4_ = local_2760._0_4_ * auVar53._0_4_;
              auVar49._4_4_ = local_2760._4_4_ * auVar53._4_4_;
              auVar49._8_4_ = local_2760._8_4_ * auVar53._8_4_;
              auVar49._12_4_ = local_2760._12_4_ * auVar53._12_4_;
              local_2710 = vminps_avx(auVar49,auVar74);
              auVar50._8_4_ = 0x7f800000;
              auVar50._0_8_ = 0x7f8000007f800000;
              auVar50._12_4_ = 0x7f800000;
              auVar53 = vblendvps_avx(auVar50,local_2700,local_27f0);
              auVar64 = vshufps_avx(auVar53,auVar53,0xb1);
              auVar64 = vminps_avx(auVar64,auVar53);
              auVar70 = vshufpd_avx(auVar64,auVar64,1);
              auVar64 = vminps_avx(auVar70,auVar64);
              auVar64 = vcmpps_avx(auVar53,auVar64,0);
              auVar70 = local_27f0 & auVar64;
              auVar53 = local_27f0;
              if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar70[0xf] < '\0') {
                auVar53 = vandps_avx(auVar64,local_27f0);
              }
              lVar43 = lVar43 + uVar41;
              uVar38 = vmovmskps_avx(auVar53);
              lVar39 = 0;
              for (uVar26 = CONCAT44((int)((ulong)local_2740 >> 0x20),uVar38); (uVar26 & 1) == 0;
                  uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar39 = lVar39 + 1;
              }
              local_2820 = pSVar29;
              local_2730 = local_27f0;
              do {
                uVar6 = *(uint *)(lVar43 + 0x90 + lVar39 * 4);
                pRVar27 = (RayHitK<8> *)(ulong)uVar6;
                pGVar8 = (pSVar29->geometries).items[(long)pRVar27].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_27f0 + lVar39 * 4) = 0;
                  pSVar29 = local_2820;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar38 = *(undefined4 *)(local_2720 + lVar39 * 4);
                    uVar4 = *(undefined4 *)(local_2710 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26f0 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26e0 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_26d0 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar38;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)(lVar43 + 0xa0 + lVar39 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    unaff_R12 = local_27d8;
                    break;
                  }
                  local_2460 = *(undefined4 *)(local_2720 + lVar39 * 4);
                  local_2440 = *(undefined4 *)(local_2710 + lVar39 * 4);
                  local_2420 = *(undefined4 *)(lVar43 + 0xa0 + lVar39 * 4);
                  uVar38 = *(undefined4 *)(local_26f0 + lVar39 * 4);
                  local_24c0._4_4_ = uVar38;
                  local_24c0._0_4_ = uVar38;
                  local_24c0._8_4_ = uVar38;
                  local_24c0._12_4_ = uVar38;
                  local_24c0._16_4_ = uVar38;
                  local_24c0._20_4_ = uVar38;
                  local_24c0._24_4_ = uVar38;
                  local_24c0._28_4_ = uVar38;
                  uVar38 = *(undefined4 *)(local_26e0 + lVar39 * 4);
                  local_24a0._4_4_ = uVar38;
                  local_24a0._0_4_ = uVar38;
                  local_24a0._8_4_ = uVar38;
                  local_24a0._12_4_ = uVar38;
                  local_24a0._16_4_ = uVar38;
                  local_24a0._20_4_ = uVar38;
                  local_24a0._24_4_ = uVar38;
                  local_24a0._28_4_ = uVar38;
                  uVar38 = *(undefined4 *)(local_26d0 + lVar39 * 4);
                  local_2480._4_4_ = uVar38;
                  local_2480._0_4_ = uVar38;
                  local_2480._8_4_ = uVar38;
                  local_2480._12_4_ = uVar38;
                  local_2480._16_4_ = uVar38;
                  local_2480._20_4_ = uVar38;
                  local_2480._24_4_ = uVar38;
                  local_2480._28_4_ = uVar38;
                  local_2400._4_4_ = uVar6;
                  local_2400._0_4_ = uVar6;
                  local_2400._8_4_ = uVar6;
                  local_2400._12_4_ = uVar6;
                  local_2400._16_4_ = uVar6;
                  local_2400._20_4_ = uVar6;
                  local_2400._24_4_ = uVar6;
                  local_2400._28_4_ = uVar6;
                  uStack_245c = local_2460;
                  uStack_2458 = local_2460;
                  uStack_2454 = local_2460;
                  uStack_2450 = local_2460;
                  uStack_244c = local_2460;
                  uStack_2448 = local_2460;
                  uStack_2444 = local_2460;
                  uStack_243c = local_2440;
                  uStack_2438 = local_2440;
                  uStack_2434 = local_2440;
                  uStack_2430 = local_2440;
                  uStack_242c = local_2440;
                  uStack_2428 = local_2440;
                  uStack_2424 = local_2440;
                  uStack_241c = local_2420;
                  uStack_2418 = local_2420;
                  uStack_2414 = local_2420;
                  uStack_2410 = local_2420;
                  uStack_240c = local_2420;
                  uStack_2408 = local_2420;
                  uStack_2404 = local_2420;
                  auVar62 = vpcmpeqd_avx2(local_2400,local_2400);
                  uStack_23dc = context->user->instID[0];
                  local_23e0 = uStack_23dc;
                  uStack_23d8 = uStack_23dc;
                  uStack_23d4 = uStack_23dc;
                  uStack_23d0 = uStack_23dc;
                  uStack_23cc = uStack_23dc;
                  uStack_23c8 = uStack_23dc;
                  uStack_23c4 = uStack_23dc;
                  uStack_23bc = context->user->instPrimID[0];
                  local_23c0 = uStack_23bc;
                  uStack_23b8 = uStack_23bc;
                  uStack_23b4 = uStack_23bc;
                  uStack_23b0 = uStack_23bc;
                  uStack_23ac = uStack_23bc;
                  uStack_23a8 = uStack_23bc;
                  uStack_23a4 = uStack_23bc;
                  uVar38 = *(undefined4 *)(ray + k * 4 + 0x100);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + lVar39 * 4);
                  local_26a0 = local_2600._0_8_;
                  uStack_2698 = local_2600._8_8_;
                  uStack_2690 = local_2600._16_8_;
                  uStack_2688 = local_2600._24_8_;
                  local_27a0 = &local_26a0;
                  local_2798 = pGVar8->userPtr;
                  local_2790 = context->user;
                  local_2780 = &local_24c0;
                  local_2778 = 8;
                  pRVar27 = (RayHitK<8> *)pGVar8->intersectionFilterN;
                  local_2788 = ray;
                  if (pRVar27 != (RayHitK<8> *)0x0) {
                    local_2840._0_8_ = lVar34;
                    local_27d0._0_8_ = pauVar37;
                    local_2830._0_8_ = lVar28;
                    local_2800 = auVar52._0_16_;
                    local_2810._0_4_ = uVar38;
                    auVar62 = ZEXT1632(auVar62._0_16_);
                    pRVar27 = (RayHitK<8> *)(*(code *)pRVar27)(&local_27a0);
                    auVar52 = ZEXT1664(local_2800);
                    auVar62 = vpcmpeqd_avx2(auVar62,auVar62);
                    lVar28 = local_2830._0_8_;
                    uVar30 = local_2850;
                    lVar34 = local_2840._0_8_;
                    uVar35 = local_2858;
                    ray = local_2848;
                    pauVar37 = (undefined1 (*) [16])local_27d0._0_8_;
                    uVar38 = local_2810._0_4_;
                  }
                  auVar96._8_8_ = uStack_2698;
                  auVar96._0_8_ = local_26a0;
                  auVar96._16_8_ = uStack_2690;
                  auVar96._24_8_ = uStack_2688;
                  auVar98 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar96);
                  auVar96 = auVar62 & ~auVar98;
                  if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar96 >> 0x7f,0) == '\0') &&
                        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar96 >> 0xbf,0) == '\0') &&
                      (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar96[0x1f]) {
                    auVar98 = auVar98 ^ auVar62;
                  }
                  else {
                    pRVar27 = (RayHitK<8> *)context->args->filter;
                    if ((pRVar27 != (RayHitK<8> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      local_2840._0_8_ = lVar34;
                      local_2830._0_8_ = lVar28;
                      local_2800 = auVar52._0_16_;
                      local_2810._0_4_ = uVar38;
                      auVar62 = ZEXT1632(auVar62._0_16_);
                      pRVar27 = (RayHitK<8> *)(*(code *)pRVar27)(&local_27a0);
                      auVar52 = ZEXT1664(local_2800);
                      auVar62 = vpcmpeqd_avx2(auVar62,auVar62);
                      lVar28 = local_2830._0_8_;
                      uVar30 = local_2850;
                      lVar34 = local_2840._0_8_;
                      uVar35 = local_2858;
                      ray = local_2848;
                      uVar38 = local_2810._0_4_;
                    }
                    auVar98._8_8_ = uStack_2698;
                    auVar98._0_8_ = local_26a0;
                    auVar98._16_8_ = uStack_2690;
                    auVar98._24_8_ = uStack_2688;
                    auVar18 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar98);
                    auVar98 = auVar18 ^ auVar62;
                    auVar96 = auVar62 & ~auVar18;
                    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar96 >> 0x7f,0) != '\0') ||
                          (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar96 >> 0xbf,0) != '\0') ||
                        (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar96[0x1f] < '\0') {
                      auVar63._0_4_ = auVar18._0_4_ ^ auVar62._0_4_;
                      auVar63._4_4_ = auVar18._4_4_ ^ auVar62._4_4_;
                      auVar63._8_4_ = auVar18._8_4_ ^ auVar62._8_4_;
                      auVar63._12_4_ = auVar18._12_4_ ^ auVar62._12_4_;
                      auVar63._16_4_ = auVar18._16_4_ ^ auVar62._16_4_;
                      auVar63._20_4_ = auVar18._20_4_ ^ auVar62._20_4_;
                      auVar63._24_4_ = auVar18._24_4_ ^ auVar62._24_4_;
                      auVar63._28_4_ = auVar18._28_4_ ^ auVar62._28_4_;
                      auVar62 = vmaskmovps_avx(auVar63,*local_2780);
                      *(undefined1 (*) [32])(local_2788 + 0x180) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar63,local_2780[1]);
                      *(undefined1 (*) [32])(local_2788 + 0x1a0) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar63,local_2780[2]);
                      *(undefined1 (*) [32])(local_2788 + 0x1c0) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar63,local_2780[3]);
                      *(undefined1 (*) [32])(local_2788 + 0x1e0) = auVar62;
                      auVar62 = vmaskmovps_avx(auVar63,local_2780[4]);
                      *(undefined1 (*) [32])(local_2788 + 0x200) = auVar62;
                      auVar62 = vpmaskmovd_avx2(auVar63,local_2780[5]);
                      *(undefined1 (*) [32])(local_2788 + 0x220) = auVar62;
                      auVar62 = vpmaskmovd_avx2(auVar63,local_2780[6]);
                      *(undefined1 (*) [32])(local_2788 + 0x240) = auVar62;
                      auVar62 = vpmaskmovd_avx2(auVar63,local_2780[7]);
                      *(undefined1 (*) [32])(local_2788 + 0x260) = auVar62;
                      auVar62 = vpmaskmovd_avx2(auVar63,local_2780[8]);
                      *(undefined1 (*) [32])(local_2788 + 0x280) = auVar62;
                      pRVar27 = local_2788;
                    }
                  }
                  if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar98 >> 0x7f,0) == '\0') &&
                        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar98 >> 0xbf,0) == '\0') &&
                      (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar98[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar38;
                  }
                  *(undefined4 *)(local_27f0 + lVar39 * 4) = 0;
                  uVar38 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar51._4_4_ = uVar38;
                  auVar51._0_4_ = uVar38;
                  auVar51._8_4_ = uVar38;
                  auVar51._12_4_ = uVar38;
                  auVar53 = vcmpps_avx(auVar52._0_16_,auVar51,2);
                  local_27f0 = vandps_avx(auVar53,local_27f0);
                  pSVar29 = local_2820;
                }
                unaff_R12 = local_27d8;
                if ((((local_27f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_27f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_27f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_27f0[0xf]) break;
                auVar61._8_4_ = 0x7f800000;
                auVar61._0_8_ = 0x7f8000007f800000;
                auVar61._12_4_ = 0x7f800000;
                auVar53 = vblendvps_avx(auVar61,auVar52._0_16_,local_27f0);
                auVar64 = vshufps_avx(auVar53,auVar53,0xb1);
                auVar64 = vminps_avx(auVar64,auVar53);
                auVar70 = vshufpd_avx(auVar64,auVar64,1);
                auVar64 = vminps_avx(auVar70,auVar64);
                auVar64 = vcmpps_avx(auVar53,auVar64,0);
                auVar70 = local_27f0 & auVar64;
                auVar53 = local_27f0;
                if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar70[0xf] < '\0') {
                  auVar53 = vandps_avx(auVar64,local_27f0);
                }
                uVar38 = vmovmskps_avx(auVar53);
                lVar39 = 0;
                for (uVar26 = CONCAT44((int)((ulong)pRVar27 >> 0x20),uVar38); (uVar26 & 1) == 0;
                    uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                  lVar39 = lVar39 + 1;
                }
              } while( true );
            }
          }
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != lVar28);
    }
    uVar38 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar52 = ZEXT3264(CONCAT428(uVar38,CONCAT424(uVar38,CONCAT420(uVar38,CONCAT416(uVar38,CONCAT412
                                                  (uVar38,CONCAT48(uVar38,CONCAT44(uVar38,uVar38))))
                                                  ))));
    auVar90 = ZEXT3264(local_24e0);
    auVar97 = ZEXT3264(local_2500);
    auVar99 = ZEXT3264(local_2520);
    auVar101 = ZEXT3264(local_2540);
    auVar104 = ZEXT3264(local_2560);
    auVar105 = ZEXT3264(local_2580);
    auVar106 = ZEXT3264(local_25a0);
    auVar108 = ZEXT3264(local_25c0);
    auVar110 = ZEXT3264(local_25e0);
    auVar114 = ZEXT3264(local_26c0);
    uVar26 = local_27b8;
    uVar42 = local_27c0;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }